

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree.cpp
# Opt level: O1

ll __thiscall Segtree::pointQuery(Segtree *this,int i)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (this->r - this->l == 1) break;
    lVar1 = lVar1 + this->val;
    this = (&this->lson)[(this->l + this->r) / 2 <= i];
  }
  return lVar1 + this->val;
}

Assistant:

ll pointQuery(int i) const {
        if (r - l == 1) return val;
        int mid = (l + r) / 2;
        return val + ((i < mid) ? lson : rson)->pointQuery(i);
    }